

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               BuriedDeployment dep)

{
  long lVar1;
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffd78;
  UniValue in_stack_fffffffffffffd88;
  UniValue local_210;
  string local_1b8 [32];
  UniValue local_198;
  string local_140 [32];
  UniValue local_120;
  string local_c8 [32];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  UniValue rv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DeploymentEnabled<Consensus::BuriedDeployment>(chainman,dep);
  if (bVar2) {
    local_a8 = local_98;
    local_a0 = 0;
    local_98[0] = 0;
    str._M_string_length._0_4_ = in_stack_fffffffffffffd70;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
    str._M_string_length._4_4_ = in_stack_fffffffffffffd74;
    str.field_2 = in_stack_fffffffffffffd78;
    UniValue::UniValue(&rv,VOBJ,str);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"type",(allocator<char> *)&stack0xfffffffffffffd70);
    UniValue::UniValue<const_char_(&)[7],_char[7],_true>(&local_120,(char (*) [7])"buried");
    key._M_string_length._0_4_ = in_stack_fffffffffffffd70;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
    key._M_string_length._4_4_ = in_stack_fffffffffffffd74;
    key.field_2 = in_stack_fffffffffffffd78;
    UniValue::pushKV(&rv,key,in_stack_fffffffffffffd88);
    UniValue::~UniValue(&local_120);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"active",(allocator<char> *)&stack0xfffffffffffffd70);
    bVar2 = DeploymentActiveAfter<Consensus::BuriedDeployment>(blockindex,chainman,dep);
    uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd74);
    UniValue::UniValue<bool,_bool,_true>(&local_198,(bool *)&stack0xfffffffffffffd77);
    key_00._M_string_length._0_4_ = in_stack_fffffffffffffd70;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
    key_00._M_string_length._4_4_ = uVar4;
    key_00.field_2 = in_stack_fffffffffffffd78;
    UniValue::pushKV(&rv,key_00,in_stack_fffffffffffffd88);
    UniValue::~UniValue(&local_198);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1b8,"height",(allocator<char> *)&stack0xfffffffffffffd77);
    iVar3 = Consensus::Params::DeploymentHeight(&((chainman->m_options).chainparams)->consensus,dep)
    ;
    UniValue::UniValue<int,_int,_true>(&local_210,(int *)&stack0xfffffffffffffd70);
    key_01._M_string_length._0_4_ = iVar3;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
    key_01._M_string_length._4_4_ = uVar4;
    key_01.field_2 = in_stack_fffffffffffffd78;
    UniValue::pushKV(&rv,key_01,in_stack_fffffffffffffd88);
    UniValue::~UniValue(&local_210);
    std::__cxx11::string::~string(local_1b8);
    DeploymentName_abi_cxx11_((string *)&stack0xfffffffffffffdd0,dep);
    UniValue::UniValue((UniValue *)&stack0xfffffffffffffd78,&rv);
    key_02._M_string_length._0_4_ = iVar3;
    key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
    key_02._M_string_length._4_4_ = uVar4;
    key_02.field_2 = in_stack_fffffffffffffd78;
    UniValue::pushKV(softforks,key_02,in_stack_fffffffffffffd88);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffd78);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    UniValue::~UniValue(&rv);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::BuriedDeployment dep)
{
    // For buried deployments.

    if (!DeploymentEnabled(chainman, dep)) return;

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "buried");
    // getdeploymentinfo reports the softfork as active from when the chain height is
    // one below the activation height
    rv.pushKV("active", DeploymentActiveAfter(blockindex, chainman, dep));
    rv.pushKV("height", chainman.GetConsensus().DeploymentHeight(dep));
    softforks.pushKV(DeploymentName(dep), std::move(rv));
}